

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv32_impl.h
# Opt level: O2

void secp256k1_modinv32_update_de_30
               (secp256k1_modinv32_signed30 *d,secp256k1_modinv32_signed30 *e,
               secp256k1_modinv32_trans2x2 *t,secp256k1_modinv32_modinfo *modinfo)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  undefined8 uVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  long lVar16;
  uint uVar17;
  char *pcVar18;
  long lVar19;
  
  uVar1 = t->u;
  lVar6 = (long)(int)uVar1;
  uVar2 = t->v;
  lVar7 = (long)(int)uVar2;
  uVar3 = t->q;
  lVar8 = (long)(int)uVar3;
  uVar4 = t->r;
  lVar14 = (long)(int)uVar4;
  iVar5 = secp256k1_modinv32_mul_cmp_30(d,9,&modinfo->modulus,-2);
  if (iVar5 < 1) {
    pcVar18 = 
    "test condition failed: secp256k1_modinv32_mul_cmp_30(d, 9, &modinfo->modulus, -2) > 0";
    uVar12 = 0x19e;
  }
  else {
    iVar5 = secp256k1_modinv32_mul_cmp_30(d,9,&modinfo->modulus,1);
    if (iVar5 < 0) {
      iVar5 = secp256k1_modinv32_mul_cmp_30(e,9,&modinfo->modulus,-2);
      if (iVar5 < 1) {
        pcVar18 = 
        "test condition failed: secp256k1_modinv32_mul_cmp_30(e, 9, &modinfo->modulus, -2) > 0";
        uVar12 = 0x1a0;
      }
      else {
        iVar5 = secp256k1_modinv32_mul_cmp_30(e,9,&modinfo->modulus,1);
        if (iVar5 < 0) {
          lVar9 = -lVar6;
          if (0 < lVar6) {
            lVar9 = lVar6;
          }
          lVar10 = -lVar7;
          if (lVar7 < 1) {
            lVar10 = lVar7;
          }
          if (lVar10 + 0x40000000 < lVar9) {
            pcVar18 = "test condition failed: labs(u) <= (M30 + 1 - labs(v))";
            uVar12 = 0x1a2;
          }
          else {
            lVar9 = -lVar8;
            if (0 < lVar8) {
              lVar9 = lVar8;
            }
            lVar10 = -lVar14;
            if (lVar14 < 1) {
              lVar10 = lVar14;
            }
            if (lVar10 + 0x40000000 < lVar9) {
              pcVar18 = "test condition failed: labs(q) <= (M30 + 1 - labs(r))";
              uVar12 = 0x1a3;
            }
            else {
              uVar17 = d->v[8] >> 0x1f;
              uVar15 = e->v[8] >> 0x1f;
              iVar5 = (uVar15 & uVar2) + (uVar17 & uVar1);
              lVar16 = e->v[0] * lVar7 + d->v[0] * lVar6;
              lVar10 = (long)(modinfo->modulus).v[0];
              lVar9 = (long)(int)(iVar5 - ((int)lVar16 * modinfo->modulus_inv30 + iVar5 & 0x3fffffff
                                          ));
              uVar13 = lVar9 * lVar10 + lVar16;
              if ((uVar13 & 0x3fffffff) == 0) {
                iVar5 = (uVar15 & uVar4) + (uVar17 & uVar3);
                lVar19 = e->v[0] * lVar14 + d->v[0] * lVar8;
                lVar16 = (long)(int)(iVar5 - (modinfo->modulus_inv30 * (int)lVar19 + iVar5 &
                                             0x3fffffff));
                uVar11 = lVar10 * lVar16 + lVar19;
                if ((uVar11 & 0x3fffffff) == 0) {
                  lVar10 = 1;
                  while( true ) {
                    if (lVar10 == 9) break;
                    lVar19 = (long)(modinfo->modulus).v[lVar10];
                    uVar13 = d->v[lVar10] * lVar6 + ((long)uVar13 >> 0x1e) +
                             lVar19 * lVar9 + e->v[lVar10] * lVar7;
                    uVar11 = d->v[lVar10] * lVar8 + ((long)uVar11 >> 0x1e) +
                             lVar19 * lVar16 + e->v[lVar10] * lVar14;
                    d->v[lVar10 + -1] = (uint)uVar13 & 0x3fffffff;
                    e->v[lVar10 + -1] = (uint)uVar11 & 0x3fffffff;
                    lVar10 = lVar10 + 1;
                  }
                  d->v[8] = (int32_t)((long)uVar13 >> 0x1e);
                  e->v[8] = (int32_t)((long)uVar11 >> 0x1e);
                  iVar5 = secp256k1_modinv32_mul_cmp_30(d,9,&modinfo->modulus,-2);
                  if (iVar5 < 1) {
                    pcVar18 = 
                    "test condition failed: secp256k1_modinv32_mul_cmp_30(d, 9, &modinfo->modulus, -2) > 0"
                    ;
                    uVar12 = 0x1c8;
                  }
                  else {
                    iVar5 = secp256k1_modinv32_mul_cmp_30(d,9,&modinfo->modulus,1);
                    if (iVar5 < 0) {
                      iVar5 = secp256k1_modinv32_mul_cmp_30(e,9,&modinfo->modulus,-2);
                      if (iVar5 < 1) {
                        pcVar18 = 
                        "test condition failed: secp256k1_modinv32_mul_cmp_30(e, 9, &modinfo->modulus, -2) > 0"
                        ;
                        uVar12 = 0x1ca;
                      }
                      else {
                        iVar5 = secp256k1_modinv32_mul_cmp_30(e,9,&modinfo->modulus,1);
                        if (iVar5 < 0) {
                          return;
                        }
                        pcVar18 = 
                        "test condition failed: secp256k1_modinv32_mul_cmp_30(e, 9, &modinfo->modulus, 1) < 0"
                        ;
                        uVar12 = 0x1cb;
                      }
                    }
                    else {
                      pcVar18 = 
                      "test condition failed: secp256k1_modinv32_mul_cmp_30(d, 9, &modinfo->modulus, 1) < 0"
                      ;
                      uVar12 = 0x1c9;
                    }
                  }
                }
                else {
                  pcVar18 = "test condition failed: ((int32_t)ce & M30) == 0";
                  uVar12 = 0x1b7;
                }
              }
              else {
                pcVar18 = "test condition failed: ((int32_t)cd & M30) == 0";
                uVar12 = 0x1b6;
              }
            }
          }
        }
        else {
          pcVar18 = 
          "test condition failed: secp256k1_modinv32_mul_cmp_30(e, 9, &modinfo->modulus, 1) < 0";
          uVar12 = 0x1a1;
        }
      }
    }
    else {
      pcVar18 = 
      "test condition failed: secp256k1_modinv32_mul_cmp_30(d, 9, &modinfo->modulus, 1) < 0";
      uVar12 = 0x19f;
    }
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modinv32_impl.h"
          ,uVar12,pcVar18);
  abort();
}

Assistant:

static void secp256k1_modinv32_update_de_30(secp256k1_modinv32_signed30 *d, secp256k1_modinv32_signed30 *e, const secp256k1_modinv32_trans2x2 *t, const secp256k1_modinv32_modinfo* modinfo) {
    const int32_t M30 = (int32_t)(UINT32_MAX >> 2);
    const int32_t u = t->u, v = t->v, q = t->q, r = t->r;
    int32_t di, ei, md, me, sd, se;
    int64_t cd, ce;
    int i;
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(d, 9, &modinfo->modulus, -2) > 0); /* d > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(d, 9, &modinfo->modulus, 1) < 0);  /* d <    modulus */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(e, 9, &modinfo->modulus, -2) > 0); /* e > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(e, 9, &modinfo->modulus, 1) < 0);  /* e <    modulus */
    VERIFY_CHECK(labs(u) <= (M30 + 1 - labs(v))); /* |u|+|v| <= 2^30 */
    VERIFY_CHECK(labs(q) <= (M30 + 1 - labs(r))); /* |q|+|r| <= 2^30 */

    /* [md,me] start as zero; plus [u,q] if d is negative; plus [v,r] if e is negative. */
    sd = d->v[8] >> 31;
    se = e->v[8] >> 31;
    md = (u & sd) + (v & se);
    me = (q & sd) + (r & se);
    /* Begin computing t*[d,e]. */
    di = d->v[0];
    ei = e->v[0];
    cd = (int64_t)u * di + (int64_t)v * ei;
    ce = (int64_t)q * di + (int64_t)r * ei;
    /* Correct md,me so that t*[d,e]+modulus*[md,me] has 30 zero bottom bits. */
    md -= (modinfo->modulus_inv30 * (uint32_t)cd + md) & M30;
    me -= (modinfo->modulus_inv30 * (uint32_t)ce + me) & M30;
    /* Update the beginning of computation for t*[d,e]+modulus*[md,me] now md,me are known. */
    cd += (int64_t)modinfo->modulus.v[0] * md;
    ce += (int64_t)modinfo->modulus.v[0] * me;
    /* Verify that the low 30 bits of the computation are indeed zero, and then throw them away. */
    VERIFY_CHECK(((int32_t)cd & M30) == 0); cd >>= 30;
    VERIFY_CHECK(((int32_t)ce & M30) == 0); ce >>= 30;
    /* Now iteratively compute limb i=1..8 of t*[d,e]+modulus*[md,me], and store them in output
     * limb i-1 (shifting down by 30 bits). */
    for (i = 1; i < 9; ++i) {
        di = d->v[i];
        ei = e->v[i];
        cd += (int64_t)u * di + (int64_t)v * ei;
        ce += (int64_t)q * di + (int64_t)r * ei;
        cd += (int64_t)modinfo->modulus.v[i] * md;
        ce += (int64_t)modinfo->modulus.v[i] * me;
        d->v[i - 1] = (int32_t)cd & M30; cd >>= 30;
        e->v[i - 1] = (int32_t)ce & M30; ce >>= 30;
    }
    /* What remains is limb 9 of t*[d,e]+modulus*[md,me]; store it as output limb 8. */
    d->v[8] = (int32_t)cd;
    e->v[8] = (int32_t)ce;

    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(d, 9, &modinfo->modulus, -2) > 0); /* d > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(d, 9, &modinfo->modulus, 1) < 0);  /* d <    modulus */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(e, 9, &modinfo->modulus, -2) > 0); /* e > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(e, 9, &modinfo->modulus, 1) < 0);  /* e <    modulus */
}